

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Int_t *
Gia_SimAbsPerformOne
          (Gia_Man_t *pGia,word *pOffSet,word *pOnSet,Vec_Wrd_t *vSimsCands,int nWords,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Vec_Int_t *vResub;
  Gia_SimAbsMan_t *p;
  abctime aVar3;
  abctime time;
  
  aVar2 = Abc_Clock();
  vResub = Vec_IntAlloc(10);
  p = Gia_SimAbsAlloc(pGia,pOffSet,pOnSet,vSimsCands,nWords,vResub,fVerbose);
  Gia_SimAbsInit(p);
  do {
    Gia_SimAbsSolve(p);
    iVar1 = Gia_SimAbsRefine(p);
  } while (iVar1 != 0);
  Gia_SimAbsFree(p);
  aVar3 = Abc_Clock();
  Abc_PrintTime(0x85f37d,(char *)(aVar3 - aVar2),time);
  return vResub;
}

Assistant:

Vec_Int_t * Gia_SimAbsPerformOne( Gia_Man_t * pGia, word * pOffSet, word * pOnSet, Vec_Wrd_t * vSimsCands, int nWords, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vResub  = Vec_IntAlloc( 10 );
    Gia_SimAbsMan_t * p = Gia_SimAbsAlloc( pGia, pOffSet, pOnSet, vSimsCands, nWords, vResub, fVerbose );
    Gia_SimAbsInit( p );
    while ( 1 )
    {
        Gia_SimAbsSolve( p );
        if ( !Gia_SimAbsRefine( p ) )
            break;
    }
    Gia_SimAbsFree( p );
    Abc_PrintTime( 1, "Resubstitution time", Abc_Clock() - clk );
    return vResub;
}